

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoalType.cpp
# Opt level: O0

void __thiscall GoalType::set_methods(GoalType *this,int n)

{
  undefined8 uVar1;
  uint in_ESI;
  long in_RDI;
  
  if ((*(byte *)(in_RDI + 0x21) & 1) == 0) {
    *(uint *)(in_RDI + 0x24) = in_ESI;
    *(undefined1 *)(in_RDI + 0x21) = 1;
  }
  else if (*(uint *)(in_RDI + 0x24) != in_ESI) {
    uVar1 = std::__cxx11::string::c_str();
    printf("Type %s had %d methods, set_methods tried to change it to %d\n",uVar1,
           (ulong)*(uint *)(in_RDI + 0x24),(ulong)in_ESI);
  }
  return;
}

Assistant:

void GoalType::set_methods(int n) {
  if (m_method_count_set) {
    if (m_method_count != n) {
      printf("Type %s had %d methods, set_methods tried to change it to %d\n", m_name.c_str(),
             m_method_count, n);
    }
  } else {
    m_method_count = n;
    m_method_count_set = true;
  }
}